

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uuid.cpp
# Opt level: O0

UInt128 __thiscall clickhouse::ColumnUUID::At(ColumnUUID *this,size_t n)

{
  unsigned_long *__a;
  unsigned_long *__b;
  long in_RDI;
  ColumnVector<unsigned_long> *this_00;
  size_t in_stack_ffffffffffffffc8;
  UInt128 local_10;
  
  this_00 = (ColumnVector<unsigned_long> *)(in_RDI + 0x28);
  std::
  __shared_ptr_access<clickhouse::ColumnVector<unsigned_long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<clickhouse::ColumnVector<unsigned_long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x23bc51);
  __a = ColumnVector<unsigned_long>::At(this_00,in_stack_ffffffffffffffc8);
  std::
  __shared_ptr_access<clickhouse::ColumnVector<unsigned_long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<clickhouse::ColumnVector<unsigned_long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x23bc70);
  __b = ColumnVector<unsigned_long>::At(this_00,in_stack_ffffffffffffffc8);
  std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long,_unsigned_long,_true>
            (&local_10,__a,__b);
  return local_10;
}

Assistant:

const UInt128 ColumnUUID::At(size_t n) const {
    return UInt128(data_->At(n * 2), data_->At(n * 2 + 1));
}